

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void la_list_free_full(la_list *l,_func_void_varargs *node_free)

{
  if (l != (la_list *)0x0) {
    la_list_free_full(l->next,node_free);
    l->next = (la_list *)0x0;
    if (node_free == (_func_void_varargs *)0x0) {
      free(l->data);
    }
    else {
      (*node_free)();
    }
    free(l);
    return;
  }
  return;
}

Assistant:

void la_list_free_full(la_list *l, void (*node_free)()) {
	if(l == NULL) {
		return;
	}
	la_list_free_full(l->next, node_free);
	l->next = NULL;
	if(node_free != NULL) {
		node_free(l->data);
	} else {
		LA_XFREE(l->data);
	}
	LA_XFREE(l);
}